

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

void vkt::api::anon_unknown_0::android::checkExtensions
               (ResultCollector *results,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *allowedExtensions,
               vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
               *reportedExtensions)

{
  bool bVar1;
  pointer __s;
  string extensionName;
  allocator<char> local_cb;
  allocator<char> local_ca;
  allocator<char> local_c9;
  ResultCollector *local_c8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c0;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *local_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  __s = (reportedExtensions->
        super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>).
        _M_impl.super__Vector_impl_data._M_start;
  local_c8 = results;
  local_c0 = allowedExtensions;
  local_b8 = reportedExtensions;
  do {
    if (__s == (local_b8->
               super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,__s->extensionName,(allocator<char> *)&local_90);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"VK_KHX_",&local_c9);
    bVar1 = de::beginsWith(&local_50,&local_90);
    if (bVar1) {
LAB_004a6a05:
      std::__cxx11::string::~string((string *)&local_90);
LAB_004a6a0d:
      bVar1 = de::
              contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                        (local_c0,&local_50);
      if (!bVar1) {
        std::operator+(&local_90,"Unknown extension: ",&local_50);
        tcu::ResultCollector::fail(local_c8,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"VK_GOOGLE_",&local_ca)
      ;
      bVar1 = de::beginsWith(&local_50,&local_b0);
      if (bVar1) {
        std::__cxx11::string::~string((string *)&local_b0);
        goto LAB_004a6a05;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"VK_ANDROID_",&local_cb);
      bVar1 = de::beginsWith(&local_50,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      if (bVar1) goto LAB_004a6a0d;
    }
    std::__cxx11::string::~string((string *)&local_50);
    __s = __s + 1;
  } while( true );
}

Assistant:

void checkExtensions (tcu::ResultCollector& results, const set<string>& allowedExtensions, const vector<VkExtensionProperties>& reportedExtensions)
{
	for (vector<VkExtensionProperties>::const_iterator extension = reportedExtensions.begin(); extension != reportedExtensions.end(); ++extension)
	{
		const string	extensionName	(extension->extensionName);
		const bool		mustBeKnown		= de::beginsWith(extensionName, "VK_KHX_")		||
										  de::beginsWith(extensionName, "VK_GOOGLE_")	||
										  de::beginsWith(extensionName, "VK_ANDROID_");

		if (mustBeKnown && !de::contains(allowedExtensions, extensionName))
			results.fail("Unknown extension: " + extensionName);
	}
}